

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O0

stb_uint stb_decompress(stb_uchar *output,stb_uchar *i,stb_uint length)

{
  stb_uint buflen;
  stb_uint sVar1;
  stb_uchar *psVar2;
  stb_uchar *old_i;
  stb_uint olen;
  stb_uint length_local;
  stb_uchar *i_local;
  stb_uchar *output_local;
  
  if (((uint)*i * 0x1000000 + (uint)i[1] * 0x10000 + (uint)i[2] * 0x100 + (uint)i[3] == 0x57bc0000)
     && ((uint)i[4] * 0x1000000 + (uint)i[5] * 0x10000 + (uint)i[6] * 0x100 + (uint)i[7] == 0)) {
    buflen = stb_decompress_length(i);
    stb__barrier3 = i + length;
    stb__barrier = output + buflen;
    stb__barrier2 = i;
    stb__barrier4 = output;
    stb__dout = output;
    _olen = i + 0x10;
    do {
      psVar2 = stb_decompress_token(_olen);
      if (psVar2 == _olen) {
        if ((*psVar2 != '\x05') || (psVar2[1] != 0xfa)) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                        ,0x27fb,"stb_uint stb_decompress(stb_uchar *, stb_uchar *, stb_uint)");
        }
        if (stb__dout != output + buflen) {
          __assert_fail("stb__dout == output + olen",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                        ,0x27f5,"stb_uint stb_decompress(stb_uchar *, stb_uchar *, stb_uint)");
        }
        if (stb__dout == output + buflen) {
          sVar1 = stb_adler32(1,output,buflen);
          if (sVar1 != (uint)psVar2[2] * 0x1000000 +
                       (uint)psVar2[3] * 0x10000 + (uint)psVar2[4] * 0x100 + (uint)psVar2[5]) {
            return 0;
          }
          return buflen;
        }
        return 0;
      }
      if (output + buflen < stb__dout) {
        __assert_fail("stb__dout <= output + olen",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                      ,0x27ff,"stb_uint stb_decompress(stb_uchar *, stb_uchar *, stb_uint)");
      }
      _olen = psVar2;
    } while (stb__dout <= output + buflen);
  }
  return 0;
}

Assistant:

stb_uint stb_decompress(stb_uchar *output, stb_uchar *i, stb_uint length)
{
   stb_uint olen;
   if (stb__in4(0) != 0x57bC0000) return 0;
   if (stb__in4(4) != 0)          return 0; // error! stream is > 4GB
   olen = stb_decompress_length(i);
   stb__barrier2 = i;
   stb__barrier3 = i+length;
   stb__barrier = output + olen;
   stb__barrier4 = output;
   i += 16;

   stb__dout = output;
   while (1) {
      stb_uchar *old_i = i;
      i = stb_decompress_token(i);
      if (i == old_i) {
         if (*i == 0x05 && i[1] == 0xfa) {
            assert(stb__dout == output + olen);
            if (stb__dout != output + olen) return 0;
            if (stb_adler32(1, output, olen) != (stb_uint) stb__in4(2))
               return 0;
            return olen;
         } else {
            assert(0); /* NOTREACHED */
            return 0;
         }
      }
      assert(stb__dout <= output + olen); 
      if (stb__dout > output + olen)
         return 0;
   }
}